

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::SetCurrentNetwork
          (PersistentStorageJson *this,RegistrarId *aNwkId)

{
  Status SVar1;
  Status SVar2;
  reference this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_20;
  
  SVar1 = CacheFromFile(this);
  SVar2 = kError;
  if (SVar1 == kSuccess) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<const_ot::commissioner::persistent_storage::NetworkId_&,_ot::commissioner::persistent_storage::NetworkId,_0>
              (&local_20,aNwkId);
    this_00 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](&this->mCache,(key_type *)JSON_CURR_NWK_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(this_00,&local_20);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_20);
    SVar2 = CacheToFile(this);
  }
  return SVar2;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::SetCurrentNetwork(const NetworkId &aNwkId)
{
    if (CacheFromFile() != PersistentStorage::Status::kSuccess)
    {
        return PersistentStorage::Status::kError;
    }

    mCache[JSON_CURR_NWK] = aNwkId;

    return CacheToFile();
}